

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::~DBImpl(DBImpl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VersionSet *this_00;
  WriteBatch *this_01;
  Writer *this_02;
  TableCache *this_03;
  Logger *pLVar2;
  Cache *pCVar3;
  char *pcVar4;
  pointer pcVar5;
  int iVar6;
  void *local_28;
  
  (this->super_DB)._vptr_DB = (_func_int **)&PTR__DBImpl_00131140;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar6 == 0) {
    (this->shutting_down_)._M_base._M_i = true;
    if (this->background_compaction_scheduled_ == true) {
      do {
        std::condition_variable::wait((unique_lock *)&this->background_work_finished_signal_);
      } while (this->background_compaction_scheduled_ != false);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    if (this->db_lock_ != (FileLock *)0x0) {
      (*this->env_->_vptr_Env[0xe])(&local_28);
      if (local_28 != (void *)0x0) {
        operator_delete__(local_28);
      }
    }
    this_00 = this->versions_;
    if (this_00 != (VersionSet *)0x0) {
      VersionSet::~VersionSet(this_00);
      operator_delete(this_00,0x250);
    }
    if (this->mem_ != (MemTable *)0x0) {
      MemTable::Unref(this->mem_);
    }
    if (this->imm_ != (MemTable *)0x0) {
      MemTable::Unref(this->imm_);
    }
    this_01 = this->tmp_batch_;
    if (this_01 != (WriteBatch *)0x0) {
      WriteBatch::~WriteBatch(this_01);
      operator_delete(this_01,0x20);
    }
    this_02 = this->log_;
    if (this_02 != (Writer *)0x0) {
      log::Writer::~Writer(this_02);
      operator_delete(this_02,0x20);
    }
    if (this->logfile_ != (WritableFile *)0x0) {
      (*this->logfile_->_vptr_WritableFile[1])();
    }
    this_03 = this->table_cache_;
    if (this_03 != (TableCache *)0x0) {
      TableCache::~TableCache(this_03);
      operator_delete(this_03,0x38);
    }
    if ((this->owns_info_log_ == true) &&
       (pLVar2 = (this->options_).info_log, pLVar2 != (Logger *)0x0)) {
      (*pLVar2->_vptr_Logger[1])();
    }
    if ((this->owns_cache_ == true) &&
       (pCVar3 = (this->options_).block_cache, pCVar3 != (Cache *)0x0)) {
      (*pCVar3->_vptr_Cache[1])();
    }
    pcVar4 = (this->bg_error_).state_;
    if (pcVar4 != (char *)0x0) {
      operator_delete__(pcVar4);
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::_M_erase(&(this->pending_outputs_)._M_t,
               (_Link_type)
               (this->pending_outputs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::_Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::
    ~_Deque_base(&(this->writers_).
                  super__Deque_base<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>
                );
    std::condition_variable::~condition_variable(&(this->background_work_finished_signal_).cv_);
    pcVar5 = (this->dbname_)._M_dataplus._M_p;
    paVar1 = &(this->dbname_).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar5 != paVar1) {
      operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
    }
    FilterPolicy::~FilterPolicy(&(this->internal_filter_policy_).super_FilterPolicy);
    Comparator::~Comparator(&(this->internal_comparator_).super_Comparator);
    return;
  }
  std::__throw_system_error(iVar6);
}

Assistant:

DBImpl::~DBImpl() {
  // Wait for background work to finish.
  mutex_.Lock();
  shutting_down_.store(true, std::memory_order_release);
  while (background_compaction_scheduled_) {
    background_work_finished_signal_.Wait();
  }
  mutex_.Unlock();

  if (db_lock_ != nullptr) {
    env_->UnlockFile(db_lock_);
  }

  delete versions_;
  if (mem_ != nullptr) mem_->Unref();
  if (imm_ != nullptr) imm_->Unref();
  delete tmp_batch_;
  delete log_;
  delete logfile_;
  delete table_cache_;

  if (owns_info_log_) {
    delete options_.info_log;
  }
  if (owns_cache_) {
    delete options_.block_cache;
  }
}